

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)4>,false>
          (Thread *this)

{
  Value VVar1;
  Value value;
  
  VVar1 = Pop(this);
  value.field_0.i64_._4_4_ = 0;
  value.field_0.i32_ = VVar1.field_0._8_4_;
  value.field_0._8_8_ = VVar1.field_0._8_8_ >> 0x20;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}